

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaUnit.cpp
# Opt level: O0

string * __thiscall Kernel::FormulaUnit::toString_abi_cxx11_(FormulaUnit *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Unit *in_stack_00000018;
  uint in_stack_0000003c;
  Formula *in_stack_000003a8;
  char __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string local_c0 [48];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  Lib::Int::toString_abi_cxx11_(in_stack_0000003c);
  std::operator+(__lhs,(char *)in_RDI);
  __rhs = (char)((ulong)in_RDI >> 0x38);
  Formula::toString_abi_cxx11_(in_stack_000003a8);
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::operator+(__lhs,__rhs);
  Unit::inferenceAsString_abi_cxx11_(in_stack_00000018);
  std::operator+(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  return __lhs;
}

Assistant:

std::string FormulaUnit::toString() const
{
  return Int::toString(_number) + ". " + _formula->toString() +
         ' ' + inferenceAsString();
}